

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,WriteToEndpoint *w)

{
  Expression *pEVar1;
  char cVar2;
  WriteToEndpoint *pWVar3;
  long *plVar4;
  long lVar5;
  ArrayView<soul::Type> local_70;
  CompileMessage local_58;
  
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(w->target).object);
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(w->value).object);
  throwErrorIfNotReadableValue((w->value).object);
  pWVar3 = w;
  do {
    pEVar1 = (pWVar3->target).object;
    if (pEVar1 == (Expression *)0x0) goto LAB_002022ce;
    pWVar3 = (WriteToEndpoint *)
             __dynamic_cast(pEVar1,&AST::Expression::typeinfo,&AST::WriteToEndpoint::typeinfo,0);
  } while (pWVar3 != (WriteToEndpoint *)0x0);
  plVar4 = (long *)__dynamic_cast(pEVar1,&AST::Expression::typeinfo,
                                  &AST::OutputEndpointRef::typeinfo,0);
  if (plVar4 == (long *)0x0) {
    lVar5 = __dynamic_cast(pEVar1,&AST::Expression::typeinfo,&AST::ArrayElementRef::typeinfo,0);
    if (((lVar5 == 0) || (*(long *)(lVar5 + 0x30) == 0)) ||
       (plVar4 = (long *)__dynamic_cast(*(long *)(lVar5 + 0x30),&AST::Expression::typeinfo,
                                        &AST::OutputEndpointRef::typeinfo,0), plVar4 == (long *)0x0)
       ) {
LAB_002022ce:
      CompileMessageHelpers::createMessage<>
                (&local_58,syntax,error,"The target for the write operator must be an output");
      AST::Context::throwError
                (&(w->super_Expression).super_Statement.super_ASTObject.context,&local_58,false);
    }
    cVar2 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (cVar2 == '\0') {
      return;
    }
    if (*(EndpointDetails **)(plVar4[6] + 0x38) == (EndpointDetails *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    AST::EndpointDetails::getResolvedDataTypes
              ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_70,
               *(EndpointDetails **)(plVar4[6] + 0x38));
    expectSilentCastPossible
              (&(w->super_Expression).super_Statement.super_ASTObject.context,local_70,
               (w->value).object);
  }
  else {
    cVar2 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (cVar2 == '\0') {
      return;
    }
    if (*(EndpointDetails **)(plVar4[6] + 0x38) == (EndpointDetails *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    AST::EndpointDetails::getSampleArrayTypes
              ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_70,
               *(EndpointDetails **)(plVar4[6] + 0x38));
    expectSilentCastPossible
              (&(w->super_Expression).super_Statement.super_ASTObject.context,local_70,
               (w->value).object);
  }
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
            ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_70);
  return;
}

Assistant:

void visit (AST::WriteToEndpoint& w) override
        {
            super::visit (w);

            throwErrorIfNotReadableValue (w.value);
            auto& topLevelWrite = ASTUtilities::getTopLevelWriteToEndpoint (w);

            // Either an OutputEndpointRef, or an ArrayElementRef of an OutputEndpointRef
            if (auto outputEndpoint = cast<AST::OutputEndpointRef> (topLevelWrite.target))
            {
                if (outputEndpoint->isResolved())
                    expectSilentCastPossible (w.context, outputEndpoint->output->getDetails().getSampleArrayTypes(), w.value);

                return;
            }

            if (auto arraySubscript = cast<AST::ArrayElementRef> (topLevelWrite.target))
            {
                if (auto outputEndpoint = cast<AST::OutputEndpointRef> (arraySubscript->object))
                {
                    if (outputEndpoint->isResolved())
                        expectSilentCastPossible (w.context, outputEndpoint->output->getDetails().getResolvedDataTypes(), w.value);

                    return;
                }
            }

            w.context.throwError (Errors::targetMustBeOutput());
            return;
        }